

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall
QOpenGLFunctions::glBufferSubData
          (QOpenGLFunctions *this,GLenum target,qopengl_GLintptr offset,qopengl_GLsizeiptr size,
          void *data)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  
  (**(code **)(*in_RDI + 0x1d0))(in_ESI,in_RDX,in_RCX,in_R8);
  return;
}

Assistant:

inline void QOpenGLFunctions::glBufferSubData(GLenum target, qopengl_GLintptr offset, qopengl_GLsizeiptr size, const void* data)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glBufferSubData(target, offset, size, data);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.BufferSubData(target, offset, size, data);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}